

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_mesh_materials.cxx
# Opt level: O2

bool __thiscall level_mesh::search_colinear_path(level_mesh *this,uint32_t v0,uint32_t v1)

{
  pointer p_Var1;
  bool bVar2;
  uint *puVar3;
  uint_fast32_t uVar4;
  b_face *this_00;
  ulong uVar5;
  float fVar6;
  float local_70;
  float fStack_6c;
  undefined4 local_68;
  float local_64;
  float local_60;
  float local_5c;
  uint_fast32_t local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  uint32_t v1_local;
  fvector3 span;
  
  local_48 = (ulong)v0;
  p_Var1 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
           super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  span.field_0.field_0.x = p_Var1[local_48].field_0.field_0.x - p_Var1[v1].field_0.field_0.x;
  span.field_0.field_0.y = p_Var1[local_48].field_0.field_0.y - p_Var1[v1].field_0.field_0.y;
  span.field_0.field_0.z = p_Var1[local_48].field_0.field_0.z - p_Var1[v1].field_0.field_0.z;
  local_50 = &this->m_path;
  v1_local = v1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_fill_assign(local_50,1,&v1_local);
  uVar5 = (ulong)v1_local;
  do {
    p_Var1 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
             super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_5c = p_Var1[uVar5].field_0.field_0.x;
    local_60 = p_Var1[uVar5].field_0.field_0.y;
    local_64 = p_Var1[uVar5].field_0.field_0.z;
    puVar3 = (this->super_xr_mesh_builder).m_vertex_faces.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start + uVar5;
    local_58 = uVar5;
    while( true ) {
      if ((ulong)*puVar3 == 0xffffffff) {
        return false;
      }
      this_00 = (this->super_xr_mesh_builder).m_faces.
                super__Vector_base<xray_re::xr_mesh_builder::b_face,_std::allocator<xray_re::xr_mesh_builder::b_face>_>
                ._M_impl.super__Vector_impl_data._M_start + *puVar3;
      uVar4 = xray_re::xr_mesh_builder::b_face::local_vert_idx(this_00,local_58);
      uVar5 = (ulong)(this_00->field_0).__refs[(uVar4 + 1) % 3];
      p_Var1 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fStack_6c = p_Var1[uVar5].field_0.field_0.y - local_60;
      local_70 = p_Var1[uVar5].field_0.field_0.x - local_5c;
      local_68 = p_Var1[uVar5].field_0.field_0.z - local_64;
      fVar6 = xray_re::_vector3<float>::cosine(&span,(_vector3<float> *)&local_70);
      if ((float)(~-(uint)(fVar6 < 1.0) & (uint)(fVar6 + -1.0) |
                 (uint)(1.0 - fVar6) & -(uint)(fVar6 < 1.0)) < 2e-06) break;
      uVar5 = (ulong)(this_00->field_0).__refs[(uVar4 + 2) % 3];
      p_Var1 = (this->super_xr_mesh_builder).super_xr_mesh.m_points.
               super__Vector_base<xray_re::_vector3<float>,_std::allocator<xray_re::_vector3<float>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      fStack_6c = p_Var1[uVar5].field_0.field_0.y - local_60;
      local_70 = p_Var1[uVar5].field_0.field_0.x - local_5c;
      local_68 = p_Var1[uVar5].field_0.field_0.z - local_64;
      fVar6 = xray_re::_vector3<float>::cosine(&span,(_vector3<float> *)&local_70);
      if ((float)(~-(uint)(fVar6 < 1.0) & (uint)(fVar6 + -1.0) |
                 (uint)(1.0 - fVar6) & -(uint)(fVar6 < 1.0)) < 2e-06) break;
      puVar3 = (uint *)((long)&this_00->field_0 + uVar4 * 4 + 0x24);
    }
    bVar2 = uVar5 != local_58;
    if (uVar5 == local_58) {
      return bVar2;
    }
    local_70 = (float)(int)uVar5;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (local_50,(uint *)&local_70);
    if (uVar5 == local_48) {
      return bVar2;
    }
  } while( true );
}

Assistant:

bool level_mesh::search_colinear_path(uint32_t v0, uint32_t v1)
{
	fvector3 px, span;
	span.sub(m_points[v0], m_points[v1]);

	m_path.assign(1, v1);
	for (uint_fast32_t vx = v1, vm;; vx = vm) {
		px.set(m_points[vm = vx]);
		for (uint_fast32_t next = m_vertex_faces[vx]; next != BAD_IDX;) {
			const b_face& face = m_faces[next];
			uint_fast32_t ix = face.local_vert_idx(vx), vt;
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 1)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			if (equivalent(span.cosine(fvector3().sub(m_points[vt = face.v[(ix + 2)%3]], px)), 1.f, 2e-6f)) {
				vm = vt;
				break;
			}
			next = face.link[ix];
		}
		if (vm == vx)
			return false;
		m_path.push_back(uint32_t(vm & UINT32_MAX));
		if (vm == v0)
			return true;
	}
	return false;
}